

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int verify_miniscript_wrapper_j(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = node->type_properties;
  iVar2 = -2;
  if ((~uVar1 & 0x401) == 0) {
    node->type_properties = (uVar1 & 0x1920f) + ((uVar1 & 0x4000) >> 1) + 0x20c00;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int verify_miniscript_wrapper_j(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop = node->type_properties;
    uint32_t need_type = MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_N;
    (void)parent;

    if ((x_prop & need_type) != need_type)
        return WALLY_EINVAL;

    node->type_properties &= MINISCRIPT_TYPE_MASK | MINISCRIPT_PROPERTY_O |
                             MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_M |
                             MINISCRIPT_PROPERTY_S;
    node->type_properties |= MINISCRIPT_PROPERTY_N | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_X;
    if (x_prop & MINISCRIPT_PROPERTY_F) {
        node->type_properties &= ~MINISCRIPT_PROPERTY_F;
        node->type_properties |= MINISCRIPT_PROPERTY_E;
    }
    return WALLY_OK;
}